

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void disableCursor(_GLFWwindow *window)

{
  _GLFWwindow *in_RDI;
  double *in_stack_00000010;
  double *in_stack_00000018;
  _GLFWwindow *in_stack_ffffffffffffffe0;
  _GLFWwindow *in_stack_fffffffffffffff0;
  
  if (in_RDI->rawMouseMotion != 0) {
    enableRawMouseMotion(in_stack_fffffffffffffff0);
  }
  _glfw.x11.disabledCursorWindow = in_RDI;
  _glfwPlatformGetCursorPos(window,in_stack_00000018,in_stack_00000010);
  updateCursorImage((_GLFWwindow *)0x58ed67);
  _glfwCenterCursorInContentArea(in_stack_ffffffffffffffe0);
  XGrabPointer(_glfw.x11.display,(in_RDI->x11).handle,1,0x4c,1,1,(in_RDI->x11).handle,
               _glfw.x11.hiddenCursorHandle,0);
  return;
}

Assistant:

static void disableCursor(_GLFWwindow* window)
{
    if (window->rawMouseMotion)
        enableRawMouseMotion(window);

    _glfw.x11.disabledCursorWindow = window;
    _glfwPlatformGetCursorPos(window,
                              &_glfw.x11.restoreCursorPosX,
                              &_glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
    _glfwCenterCursorInContentArea(window);
    XGrabPointer(_glfw.x11.display, window->x11.handle, True,
                 ButtonPressMask | ButtonReleaseMask | PointerMotionMask,
                 GrabModeAsync, GrabModeAsync,
                 window->x11.handle,
                 _glfw.x11.hiddenCursorHandle,
                 CurrentTime);
}